

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O2

string * duckdb::GetSQLValueFunctionName(string *__return_storage_ptr__,string *column_name)

{
  bool bVar1;
  string lcase;
  allocator local_31;
  string local_30;
  
  StringUtil::Lower(&local_30,column_name);
  bVar1 = ::std::operator==(&local_30,"current_catalog");
  if (bVar1) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"current_catalog",&local_31);
  }
  else {
    bVar1 = ::std::operator==(&local_30,"current_date");
    if (bVar1) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"current_date",&local_31);
    }
    else {
      bVar1 = ::std::operator==(&local_30,"current_schema");
      if (bVar1) {
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"current_schema",&local_31);
      }
      else {
        bVar1 = ::std::operator==(&local_30,"current_role");
        if (bVar1) {
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"current_role",&local_31);
        }
        else {
          bVar1 = ::std::operator==(&local_30,"current_time");
          if (bVar1) {
            ::std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"get_current_time",&local_31);
          }
          else {
            bVar1 = ::std::operator==(&local_30,"current_timestamp");
            if (bVar1) {
              ::std::__cxx11::string::string
                        ((string *)__return_storage_ptr__,"get_current_timestamp",&local_31);
            }
            else {
              bVar1 = ::std::operator==(&local_30,"current_user");
              if (bVar1) {
                ::std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,"current_user",&local_31);
              }
              else {
                bVar1 = ::std::operator==(&local_30,"localtime");
                if (bVar1) {
                  ::std::__cxx11::string::string
                            ((string *)__return_storage_ptr__,"current_localtime",&local_31);
                }
                else {
                  bVar1 = ::std::operator==(&local_30,"localtimestamp");
                  if (bVar1) {
                    ::std::__cxx11::string::string
                              ((string *)__return_storage_ptr__,"current_localtimestamp",&local_31);
                  }
                  else {
                    bVar1 = ::std::operator==(&local_30,"session_user");
                    if (bVar1) {
                      ::std::__cxx11::string::string
                                ((string *)__return_storage_ptr__,"session_user",&local_31);
                    }
                    else {
                      bVar1 = ::std::operator==(&local_30,"user");
                      if (bVar1) {
                        ::std::__cxx11::string::string
                                  ((string *)__return_storage_ptr__,"user",&local_31);
                      }
                      else {
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        __return_storage_ptr__->_M_string_length = 0;
                        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string GetSQLValueFunctionName(const string &column_name) {
	auto lcase = StringUtil::Lower(column_name);
	if (lcase == "current_catalog") {
		return "current_catalog";
	} else if (lcase == "current_date") {
		return "current_date";
	} else if (lcase == "current_schema") {
		return "current_schema";
	} else if (lcase == "current_role") {
		return "current_role";
	} else if (lcase == "current_time") {
		return "get_current_time";
	} else if (lcase == "current_timestamp") {
		return "get_current_timestamp";
	} else if (lcase == "current_user") {
		return "current_user";
	} else if (lcase == "localtime") {
		return "current_localtime";
	} else if (lcase == "localtimestamp") {
		return "current_localtimestamp";
	} else if (lcase == "session_user") {
		return "session_user";
	} else if (lcase == "user") {
		return "user";
	}
	return string();
}